

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorLink.c
# Opt level: O1

int ExorLinkCubeIteratorPick(Cube **pGroup,int g)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  if (fWorking == '\0') {
    __assert_fail("fWorking",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/exor/exorLink.c"
                  ,0x2b1,"int ExorLinkCubeIteratorPick(Cube **, int)");
  }
  if ((-1 < g) && (g < nGroups)) {
    if ((VisitedGroups & s_BitMasks[(uint)g]) == 0) {
      __assert_fail("VisitedGroups & s_BitMasks[g]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/exor/exorLink.c"
                    ,0x2b3,"int ExorLinkCubeIteratorPick(Cube **, int)");
    }
    iVar1 = GroupOrder[(uint)g];
    LastGroup = 0;
    lVar2 = (long)nCubes;
    if (0 < lVar2) {
      LastGroup = 0;
      lVar3 = (long)nDist;
      lVar4 = 0;
      do {
        CubeNum = s_ELGroupRules[lVar3][iVar1][lVar4];
        LastGroup = LastGroup | s_BitMasks[CubeNum];
        if (ELCubes[CubeNum] == (Cube *)0x0) {
          __assert_fail("ELCubes[CubeNum] != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/exor/exorLink.c"
                        ,0x2bf,"int ExorLinkCubeIteratorPick(Cube **, int)");
        }
        pGroup[lVar4] = ELCubes[CubeNum];
        lVar4 = lVar4 + 1;
      } while (lVar2 != lVar4);
    }
    return 1;
  }
  __assert_fail("g >= 0 && g < nGroups",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/exor/exorLink.c"
                ,0x2b2,"int ExorLinkCubeIteratorPick(Cube **, int)");
}

Assistant:

int ExorLinkCubeIteratorPick( Cube** pGroup, int g )
// gives the group #g in the order in which the groups were given
// during iteration
// returns 1 on success, returns 0 if something is wrong (g is too large)
{
    int GroupNum, c;

    assert( fWorking );
    assert( g >= 0 && g < nGroups );
    assert( VisitedGroups & s_BitMasks[g] );

    GroupNum = GroupOrder[g];
    // form the group
    LastGroup = 0;
    for ( c = 0; c < nCubes; c++ )
    {
        CubeNum = s_ELGroupRules[nDist][GroupNum][c];

        // remember this group as the last one
        LastGroup |= s_BitMasks[CubeNum];

        assert( ELCubes[CubeNum] != NULL ); // this cube should exist
        // prepare the return array
        pGroup[c] = ELCubes[CubeNum];
    }
    return 1;
}